

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_map.cpp
# Opt level: O3

void __thiscall tst_helpers_map::sequenceTypes(tst_helpers_map *this)

{
  char16_t **ppcVar1;
  QSharedData *pQVar2;
  _List_node_base *p_Var3;
  Data *pDVar4;
  int *piVar5;
  bool bVar6;
  _List_node_base **pp_Var7;
  pointer piVar8;
  QString *data;
  QString *pQVar9;
  ulong uVar10;
  long lVar11;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> QVar12;
  _List_node_base *p_Var13;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  PromiseResolver<QString> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_160;
  QArrayDataPointer<QString> local_158;
  vector<int,_std::allocator<int>_> local_138;
  PromiseResolver<QString> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<QString>_>_> local_118;
  allocator_type local_109;
  QArrayDataPointer<QString> local_108;
  QArrayDataPointer<QString> local_e8;
  PromiseType p;
  long local_c0;
  vector<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_> promises;
  _List_node_base *local_90 [2];
  pointer local_80;
  _List_node_base *local_78;
  _List_node_base *p_Stack_70;
  pointer local_68;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_58;
  QString local_50;
  Data *local_38;
  
  anon_unknown.dwarf_5a50b::SequenceTester<QList<int>_>::exec();
  anon_unknown.dwarf_5a50b::SequenceTester<QList<int>_>::exec();
  local_108.d = (Data *)0x2b0000002a;
  local_108.ptr = (QString *)CONCAT44(local_108.ptr._4_4_,0x2c);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_108;
  std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)&local_138,__l,(allocator_type *)&local_160);
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var13 = (_List_node_base *)
            local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if ((_List_node_base *)
      local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (_List_node_base *)&local_138) {
    do {
      local_158.d = (Data *)&PTR__QPromiseBase_0012aab8;
      pQVar9 = (QString *)operator_new(0x68);
      (pQVar9->d).d = (Data *)0x0;
      (pQVar9->d).ptr = (char16_t *)0x0;
      pQVar9[3].d.ptr = (char16_t *)0x0;
      pQVar9[3].d.size = 0;
      pQVar9[2].d.size = 0;
      pQVar9[3].d.d = (Data *)0x0;
      pQVar9[2].d.d = (Data *)0x0;
      pQVar9[2].d.ptr = (char16_t *)0x0;
      pQVar9[1].d.ptr = (char16_t *)0x0;
      pQVar9[1].d.size = 0;
      (pQVar9->d).size = 0;
      pQVar9[1].d.d = (Data *)0x0;
      pQVar9[4].d.d = (Data *)0x0;
      (pQVar9->d).d = (Data *)&PTR__PromiseDataBase_0012ab40;
      QReadWriteLock::QReadWriteLock((QReadWriteLock *)&(pQVar9->d).size,0);
      *(undefined1 *)&pQVar9[1].d.d = 0;
      pQVar9[1].d.ptr = (char16_t *)0x0;
      pQVar9[1].d.size = 0;
      pQVar9[2].d.d = (Data *)0x0;
      pQVar9[2].d.ptr = (char16_t *)0x0;
      pQVar9[2].d.size = 0;
      pQVar9[3].d.d = (Data *)0x0;
      pQVar9[3].d.ptr = (char16_t *)0x0;
      (pQVar9->d).d = (Data *)&PTR__PromiseData_0012aad8;
      pQVar9[3].d.size = 0;
      pQVar9[4].d.d = (Data *)0x0;
      LOCK();
      ppcVar1 = &(pQVar9->d).ptr;
      *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
      UNLOCK();
      if (pQVar9 != (QString *)0x0) {
        LOCK();
        ppcVar1 = &(pQVar9->d).ptr;
        *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
        UNLOCK();
      }
      local_e8.d = (Data *)&PTR__QPromiseBase_0012aa70;
      local_158.ptr = pQVar9;
      local_e8.ptr = pQVar9;
      QtPromisePrivate::PromiseResolver<QString>::PromiseResolver
                (&resolver,(QPromise<QString> *)&local_e8);
      local_e8.d = (Data *)&PTR__QPromiseBase_0012aab8;
      if (local_e8.ptr != (QString *)0x0) {
        LOCK();
        ppcVar1 = &((local_e8.ptr)->d).ptr;
        *(int *)ppcVar1 = *(int *)ppcVar1 + -1;
        UNLOCK();
        if ((*(int *)ppcVar1 == 0) && (local_e8.ptr != (QString *)0x0)) {
          (*(code *)((((local_e8.ptr)->d).d)->super_QArrayData).alloc)();
        }
      }
      if (resolver.m_d.d == (Data *)0x0) {
        resolver_1.m_d.d =
             (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>)
             (Data *)0x0;
LAB_00108268:
        bVar6 = true;
        QVar12.d = (Data *)0x0;
      }
      else {
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
        UNLOCK();
        resolver_1 = resolver;
        if (resolver.m_d.d == (Data *)0x0) goto LAB_00108268;
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
        UNLOCK();
        bVar6 = false;
        QVar12 = resolver.m_d.d;
      }
      QString::number((int)&local_50,*(int *)&p_Var13[1]._M_next + 1);
      QtPromisePrivate::PromiseResolver<QString>::resolve<QString>(&resolver_1,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,8);
        }
      }
      if (!bVar6) {
        LOCK();
        ((QVar12.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i =
             ((QVar12.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((QVar12.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
          operator_delete(QVar12.d,0x10);
        }
      }
      if (resolver_1.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
        UNLOCK();
        if (*(int *)resolver_1.m_d.d == 0) {
          operator_delete((void *)resolver_1.m_d.d,0x10);
        }
      }
      if (resolver.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
        UNLOCK();
        if (*(int *)resolver.m_d.d == 0) {
          operator_delete((void *)resolver.m_d.d,0x10);
        }
      }
      local_158.d = (Data *)&PTR__QPromiseBase_0012aa70;
      std::vector<QtPromise::QPromise<QString>,std::allocator<QtPromise::QPromise<QString>>>::
      emplace_back<QtPromise::QPromise<QString>>
                ((vector<QtPromise::QPromise<QString>,std::allocator<QtPromise::QPromise<QString>>>
                  *)&promises,(QPromise<QString> *)&local_158);
      local_158.d = (Data *)&PTR__QPromiseBase_0012aab8;
      if (local_158.ptr != (QString *)0x0) {
        LOCK();
        ppcVar1 = &((local_158.ptr)->d).ptr;
        *(int *)ppcVar1 = *(int *)ppcVar1 + -1;
        UNLOCK();
        if ((*(int *)ppcVar1 == 0) && (local_158.ptr != (QString *)0x0)) {
          (*(code *)((((local_158.ptr)->d).d)->super_QArrayData).alloc)();
        }
      }
      pp_Var7 = &p_Var13->_M_next;
      p_Var13 = *pp_Var7;
    } while (*pp_Var7 != (_List_node_base *)&local_138);
  }
  QtPromise::all<QString,_std::vector,_std::allocator<QtPromise::QPromise<QString>_>_>
            ((QtPromise *)&p,&promises);
  std::vector<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>::~vector
            (&promises);
  p_Var13 = (_List_node_base *)
            local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  while (p_Var13 != (_List_node_base *)&local_138) {
    p_Var3 = (((_List_base<int,_std::allocator<int>_> *)&p_Var13->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var13,0x18);
    p_Var13 = p_Var3;
  }
  local_158.d = (Data *)0x0;
  local_158.ptr = (QString *)0x0;
  local_158.size = 0;
  waitForValue<QList<QString>>((QList<QString> *)&local_e8,&p,(QList<QString> *)&local_158);
  QVar14.m_data = (storage_type *)0x2;
  QVar14.m_size = (qsizetype)&local_138;
  QString::fromUtf8(QVar14);
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  QVar15.m_data = (storage_type *)0x2;
  QVar15.m_size = (qsizetype)&local_138;
  QString::fromUtf8(QVar15);
  local_90[0] = (_List_node_base *)
                local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_90[1] = (_List_node_base *)
                local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_80 = (pointer)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
  QVar16.m_data = (storage_type *)0x2;
  QVar16.m_size = (qsizetype)&local_138;
  QString::fromUtf8(QVar16);
  local_78 = (_List_node_base *)
             local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
  p_Stack_70 = (_List_node_base *)
               local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_68 = (pointer)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
  local_108.ptr = (QString *)QArrayData::allocate((QArrayData **)&local_108,0x18,8,3,KeepSize);
  local_108.size = 0;
  uVar10 = 0xffffffffffffffe8;
  do {
    pDVar4 = *(Data **)((long)local_90 + uVar10);
    local_108.ptr[local_108.size].d.d = pDVar4;
    local_108.ptr[local_108.size].d.ptr = *(char16_t **)((long)local_90 + uVar10 + 8);
    local_108.ptr[local_108.size].d.size = *(qsizetype *)((long)&local_80 + uVar10);
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_108.size = local_108.size + 1;
    uVar10 = uVar10 + 0x18;
  } while (uVar10 < 0x30);
  QTest::_q_compareSequence<QList<QString>::const_iterator,QList<QString>::const_iterator>
            ((const_iterator)local_e8.ptr,local_e8.ptr + local_e8.size,(const_iterator)local_108.ptr
             ,local_108.ptr + local_108.size,"waitForValue(p, QVector<QString>{})",
             "(QVector<QString>{\"43\", \"44\", \"45\"})",
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_map.cpp"
             ,0x2c);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_108);
  lVar11 = 0x30;
  do {
    piVar5 = *(int **)((long)&promises.
                              super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar11);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        QArrayData::deallocate
                  (*(QArrayData **)
                    ((long)&promises.
                            super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar11),2,8);
      }
    }
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_e8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_158);
  local_58.d = (Data *)&PTR__QPromiseBase_0012a6a0;
  p.super_QPromiseBase<QList<QString>_>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_0012a6a0;
  if (p.super_QPromiseBase<QList<QString>_>.m_d.d != (PromiseData<QList<QString>_> *)0x0) {
    LOCK();
    pQVar2 = &((p.super_QPromiseBase<QList<QString>_>.m_d.d)->
              super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<QList<QString>_>.m_d.d != (PromiseData<QList<QString>_> *)0x0)) {
      (*((p.super_QPromiseBase<QList<QString>_>.m_d.d)->
        super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>)._vptr_PromiseDataBase
        [1])();
    }
  }
  p.super_QPromiseBase<QList<QString>_>._vptr_QPromiseBase = (_func_int **)0x2b0000002a;
  p.super_QPromiseBase<QList<QString>_>.m_d.d._0_4_ = 0x2c;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&p;
  std::vector<int,_std::allocator<int>_>::vector(&local_138,__l_00,&local_109);
  piVar8 = local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_38 = (Data *)&PTR__PromiseData_0012aad8;
    p_Var13 = (_List_node_base *)
              local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_108.d = (Data *)&PTR__QPromiseBase_0012aab8;
      pQVar9 = (QString *)operator_new(0x68);
      (pQVar9->d).d = (Data *)0x0;
      (pQVar9->d).ptr = (char16_t *)0x0;
      pQVar9[3].d.ptr = (char16_t *)0x0;
      pQVar9[3].d.size = 0;
      pQVar9[2].d.size = 0;
      pQVar9[3].d.d = (Data *)0x0;
      pQVar9[2].d.d = (Data *)0x0;
      pQVar9[2].d.ptr = (char16_t *)0x0;
      pQVar9[1].d.ptr = (char16_t *)0x0;
      pQVar9[1].d.size = 0;
      (pQVar9->d).size = 0;
      pQVar9[1].d.d = (Data *)0x0;
      pQVar9[4].d.d = (Data *)0x0;
      (pQVar9->d).d = (Data *)&PTR__PromiseDataBase_0012ab40;
      QReadWriteLock::QReadWriteLock((QReadWriteLock *)&(pQVar9->d).size,0);
      *(undefined1 *)&pQVar9[1].d.d = 0;
      pQVar9[1].d.ptr = (char16_t *)0x0;
      pQVar9[1].d.size = 0;
      pQVar9[2].d.d = (Data *)0x0;
      pQVar9[2].d.ptr = (char16_t *)0x0;
      pQVar9[2].d.size = 0;
      pQVar9[3].d.d = (Data *)0x0;
      pQVar9[3].d.ptr = (char16_t *)0x0;
      (pQVar9->d).d = local_38;
      pQVar9[3].d.size = 0;
      pQVar9[4].d.d = (Data *)0x0;
      LOCK();
      ppcVar1 = &(pQVar9->d).ptr;
      *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
      UNLOCK();
      if (pQVar9 != (QString *)0x0) {
        LOCK();
        ppcVar1 = &(pQVar9->d).ptr;
        *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
        UNLOCK();
      }
      local_158.d = (Data *)&PTR__QPromiseBase_0012aa70;
      local_158.ptr = pQVar9;
      local_108.ptr = pQVar9;
      QtPromisePrivate::PromiseResolver<QString>::PromiseResolver
                (&resolver_1,(QPromise<QString> *)&local_158);
      local_158.d = (Data *)&PTR__QPromiseBase_0012aab8;
      if (local_158.ptr != (QString *)0x0) {
        LOCK();
        ppcVar1 = &((local_158.ptr)->d).ptr;
        *(int *)ppcVar1 = *(int *)ppcVar1 + -1;
        UNLOCK();
        if ((*(int *)ppcVar1 == 0) && (local_158.ptr != (QString *)0x0)) {
          (*(code *)((((local_158.ptr)->d).d)->super_QArrayData).alloc)();
        }
      }
      if (resolver_1.m_d.d == (Data *)0x0) {
        local_160.d = (Data *)0x0;
LAB_001087e2:
        bVar6 = true;
        QVar12.d = (Data *)0x0;
      }
      else {
        LOCK();
        *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
        UNLOCK();
        local_160 = resolver_1.m_d.d;
        if (resolver_1.m_d.d == (Data *)0x0) goto LAB_001087e2;
        LOCK();
        *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
        UNLOCK();
        bVar6 = false;
        QVar12 = resolver_1.m_d.d;
      }
      QString::number((int)&local_e8,*(int *)&p_Var13->_M_next + 1);
      QtPromisePrivate::PromiseResolver<QString>::resolve<QString>
                ((PromiseResolver<QString> *)&local_160,(QString *)&local_e8);
      if (&(local_e8.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_e8.d)->super_QArrayData,2,8);
        }
      }
      if (!bVar6) {
        LOCK();
        ((QVar12.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i =
             ((QVar12.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((QVar12.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
          operator_delete(QVar12.d,0x10);
        }
      }
      if (local_160.d != (Data *)0x0) {
        LOCK();
        ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             ((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_160.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
          operator_delete(local_160.d,0x10);
        }
      }
      if (resolver_1.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
        UNLOCK();
        if (*(int *)resolver_1.m_d.d == 0) {
          operator_delete((void *)resolver_1.m_d.d,0x10);
        }
      }
      local_108.d = (Data *)&PTR__QPromiseBase_0012aa70;
      std::vector<QtPromise::QPromise<QString>,std::allocator<QtPromise::QPromise<QString>>>::
      emplace_back<QtPromise::QPromise<QString>>
                ((vector<QtPromise::QPromise<QString>,std::allocator<QtPromise::QPromise<QString>>>
                  *)&promises,(QPromise<QString> *)&local_108);
      local_108.d = (Data *)&PTR__QPromiseBase_0012aab8;
      if (local_108.ptr != (QString *)0x0) {
        LOCK();
        ppcVar1 = &((local_108.ptr)->d).ptr;
        *(int *)ppcVar1 = *(int *)ppcVar1 + -1;
        UNLOCK();
        if ((*(int *)ppcVar1 == 0) && (local_108.ptr != (QString *)0x0)) {
          (*(code *)((((local_108.ptr)->d).d)->super_QArrayData).alloc)();
        }
      }
      p_Var13 = (_List_node_base *)((long)&p_Var13->_M_next + 4);
    } while (p_Var13 != (_List_node_base *)piVar8);
  }
  QtPromise::all<QString,_std::vector,_std::allocator<QtPromise::QPromise<QString>_>_>
            ((QtPromise *)&resolver,&promises);
  std::vector<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>::~vector
            (&promises);
  if ((_List_node_base *)
      local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (_List_node_base *)0x0) {
    operator_delete(local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_108.d = (Data *)0x0;
  local_108.ptr = (QString *)0x0;
  local_108.size = 0;
  waitForValue<QList<QString>>
            ((QList<QString> *)&local_158,(QPromise<QList<QString>_> *)&resolver,
             (QList<QString> *)&local_108);
  QVar17.m_data = (storage_type *)0x2;
  QVar17.m_size = (qsizetype)&local_138;
  QString::fromUtf8(QVar17);
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  QVar18.m_data = (storage_type *)0x2;
  QVar18.m_size = (qsizetype)&local_138;
  QString::fromUtf8(QVar18);
  local_90[0] = (_List_node_base *)
                local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_90[1] = (_List_node_base *)
                local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_80 = (pointer)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
  QVar19.m_data = (storage_type *)0x2;
  QVar19.m_size = (qsizetype)&local_138;
  QString::fromUtf8(QVar19);
  local_78 = (_List_node_base *)
             local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
  p_Stack_70 = (_List_node_base *)
               local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_68 = (pointer)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
  p.super_QPromiseBase<QList<QString>_>.m_d.d =
       (PromiseData<QList<QString>_> *)QArrayData::allocate((QArrayData **)&p,0x18,8,3,KeepSize);
  local_c0 = 0;
  uVar10 = 0xffffffffffffffe8;
  do {
    pDVar4 = *(Data **)((long)local_90 + uVar10);
    (((QString *)((long)p.super_QPromiseBase<QList<QString>_>.m_d.d + local_c0 * 0x18))->d).d =
         pDVar4;
    (((QString *)((long)p.super_QPromiseBase<QList<QString>_>.m_d.d + local_c0 * 0x18))->d).ptr =
         *(char16_t **)((long)local_90 + uVar10 + 8);
    (((QString *)((long)p.super_QPromiseBase<QList<QString>_>.m_d.d + local_c0 * 0x18))->d).size =
         *(qsizetype *)((long)&local_80 + uVar10);
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c0 = local_c0 + 1;
    uVar10 = uVar10 + 0x18;
  } while (uVar10 < 0x30);
  QTest::_q_compareSequence<QList<QString>::const_iterator,QList<QString>::const_iterator>
            ((const_iterator)local_158.ptr,local_158.ptr + local_158.size,
             (const_iterator)p.super_QPromiseBase<QList<QString>_>.m_d.d,
             (QString *)((long)p.super_QPromiseBase<QList<QString>_>.m_d.d + local_c0 * 0x18),
             "waitForValue(p, QVector<QString>{})","(QVector<QString>{\"43\", \"44\", \"45\"})",
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_map.cpp"
             ,0x2c);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&p);
  lVar11 = 0x30;
  do {
    piVar5 = *(int **)((long)&promises.
                              super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar11);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        QArrayData::deallocate
                  (*(QArrayData **)
                    ((long)&promises.
                            super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar11),2,8);
      }
    }
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_158);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_108);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>)local_58.d;
  if (local_118.d != (PromiseData<QList<QString>_> *)0x0) {
    LOCK();
    pQVar2 = &((local_118.d)->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_118.d != (PromiseData<QList<QString>_> *)0x0)
       ) {
      (*((local_118.d)->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_helpers_map::sequenceTypes()
{
    SequenceTester<QList<int>>::exec();
    SequenceTester<QVector<int>>::exec();
    SequenceTester<std::list<int>>::exec();
    SequenceTester<std::vector<int>>::exec();
}